

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O1

void __thiscall bloom_filter::insert(bloom_filter *this,uchar *key_begin,size_t *length)

{
  uint *puVar1;
  byte *pbVar2;
  pointer puVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong local_48;
  size_t bit_index;
  size_t bit;
  
  local_48 = 0;
  bit_index = 0;
  puVar3 = (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    uVar8 = 0;
    do {
      bit._4_4_ = puVar3[uVar8];
      puVar4 = (uint *)key_begin;
      for (uVar5 = *length; 7 < uVar5; uVar5 = uVar5 - 8) {
        uVar6 = *puVar4;
        puVar1 = puVar4 + 1;
        puVar4 = puVar4 + 2;
        bit._4_4_ = ~(bit._4_4_ ^
                     (bit._4_4_ >> 5 ^ *puVar1) + bit._4_4_ * 0x800 ^ bit._4_4_ << 7 ^
                     (bit._4_4_ >> 3) * uVar6);
      }
      if (uVar5 != 0) {
        uVar7 = uVar5;
        if (3 < uVar5) {
          bit._4_4_ = ~((bit._4_4_ >> 5 ^ *puVar4) + bit._4_4_ * 0x800 ^ bit._4_4_);
          puVar4 = puVar4 + 1;
          uVar7 = uVar5 - 4;
        }
        uVar6 = (uint)(3 < uVar5);
        if (1 < uVar7) {
          if (uVar5 < 4) {
            bit._4_4_ = ~((bit._4_4_ >> 5 ^ (uint)(ushort)*puVar4) + bit._4_4_ * 0x800 ^ bit._4_4_);
          }
          else {
            bit._4_4_ = (bit._4_4_ >> 3) * (uint)(ushort)*puVar4 ^ bit._4_4_ << 7 ^ bit._4_4_;
          }
          uVar6 = uVar6 + 1;
          uVar7 = uVar7 - 2;
          puVar4 = (uint *)((long)puVar4 + 2);
        }
        if (uVar7 != 0) {
          bit._4_4_ = uVar6 + bit._4_4_ + (bit._4_4_ * -0x5a5a5a5b ^ (uint)(byte)*puVar4);
        }
      }
      (*this->_vptr_bloom_filter[4])(this,(long)&bit + 4,&local_48,&bit_index);
      pbVar2 = (this->bit_table_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + (local_48 >> 3);
      *pbVar2 = *pbVar2 | bit_mask[bit_index];
      uVar8 = uVar8 + 1;
      puVar3 = (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->salt_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2));
  }
  this->inserted_element_count_ = this->inserted_element_count_ + 1;
  return;
}

Assistant:

inline void insert(const unsigned char* key_begin, const std::size_t& length)
   {
      std::size_t bit_index = 0;
      std::size_t bit       = 0;

      for (std::size_t i = 0; i < salt_.size(); ++i)
      {
         compute_indices(hash_ap(key_begin, length, salt_[i]), bit_index, bit);

         bit_table_[bit_index / bits_per_char] |= bit_mask[bit];
      }

      ++inserted_element_count_;
   }